

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O1

CURLcode post_per_transfer(GlobalConfig *global,per_transfer *per,CURLcode result,_Bool *retryp)

{
  OperationConfig *config;
  CURL *curl;
  FILE *pFVar1;
  _Bool _Var2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  FILE *pFVar9;
  OutStruct *outs;
  uint uVar10;
  CURLcode CVar11;
  GlobalConfig *pGVar12;
  timeval newer;
  long cond_unmet;
  long protocol;
  undefined1 local_48 [16];
  OutStruct *local_38;
  
  config = per->config;
  curl = per->curl;
  if (config == (OperationConfig *)0x0 || curl == (CURL *)0x0) {
    return result;
  }
  *retryp = false;
  if (per->infdopen == true) {
    close(per->infd);
  }
  if (((result != CURLE_OK) && (config->synthetic_error == ERR_NONE)) && (global->showerror != 0)) {
    pFVar9 = global->errors;
    if (per->errorbuffer[0] == '\0') {
      curl_easy_strerror(result);
    }
    curl_mfprintf(pFVar9,"curl: (%d) %s\n",result);
    if (result == CURLE_PEER_FAILED_VERIFICATION) {
      fputs("More details here: https://curl.haxx.se/docs/sslcerts.html\n\ncurl failed to verify the legitimacy of the server and therefore could not\nestablish a secure connection to it. To learn more about this situation and\nhow to fix it, please visit the web page mentioned above.\n"
            ,(FILE *)global->errors);
    }
  }
  outs = &per->outs;
  local_38 = (OutStruct *)retryp;
  if (result == CURLE_OK) {
    if (((config->xattr == true) && ((per->outs).fopened == true)) &&
       (pFVar1 = (FILE *)(per->outs).stream, pFVar1 != (FILE *)0x0)) {
      iVar3 = fileno(pFVar1);
      iVar3 = fwrite_xattr(curl,iVar3);
      if (iVar3 != 0) {
        pGVar12 = config->global;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        warnf(pGVar12,"Error setting extended attributes: %s\n",pcVar5);
      }
    }
    result = CURLE_OK;
    if (((per->outs).stream == (FILE *)0x0) && ((per->outs).bytes == 0)) {
      local_48._0_8_ = 0;
      result = CURLE_OK;
      curl_easy_getinfo(curl,0x200023,local_48);
      if (local_48._0_8_ == 0) {
        _Var2 = tool_create_output_file(outs,config);
        result = CURLE_WRITE_ERROR;
        if (_Var2) {
          result = CURLE_OK;
        }
      }
    }
  }
  if (((((per->outs).s_isreg == false) &&
       (pFVar1 = (FILE *)(per->outs).stream, pFVar1 != (FILE *)0x0)) &&
      (iVar3 = fflush(pFVar1), result == CURLE_OK)) && (iVar3 != 0)) {
    result = CURLE_WRITE_ERROR;
    curl_mfprintf(global->errors,"(%d) Failed writing body\n",0x17);
  }
  if ((((per->outs).is_cd_filename == true) && ((per->outs).stream != (FILE *)0x0)) &&
     ((global->mute == false && (outs->filename != (char *)0x0)))) {
    curl_mprintf("curl: Saved to filename \'%s\'\n");
  }
  if (per->retry_numretries == 0) {
LAB_001148f2:
    if (per->metalink == true) {
      if (result == CURLE_OK) {
        local_48._8_8_ = (FILE *)0x0;
        curl_easy_getinfo(curl,0x100001,local_48 + 8);
        if ((((FILE *)local_48._8_8_ == (FILE *)0x0) ||
            (iVar3 = curl_strnequal(local_48._8_8_,"http",4), iVar3 == 0)) ||
           ((curl_easy_getinfo(curl,0x200002,local_48), local_48._0_8_ == 200 ||
            (local_48._0_8_ == 0xce)))) goto LAB_00114b89;
        per->metalink_next_res = true;
        pFVar9 = global->errors;
        pcVar5 = per->this_url;
        pcVar7 = per->mlfile->filename;
        pcVar8 = "Metalink: fetching (%s) from (%s) FAILED (HTTP status code %ld)\n";
        lVar6 = local_48._0_8_;
      }
      else {
        per->metalink_next_res = true;
        pFVar9 = global->errors;
        pcVar5 = per->this_url;
        pcVar7 = per->mlfile->filename;
        local_38 = outs;
        lVar6 = curl_easy_strerror(result);
        pcVar8 = "Metalink: fetching (%s) from (%s) FAILED (%s)\n";
        outs = local_38;
      }
      curl_mfprintf(pFVar9,pcVar8,pcVar7,pcVar5,lVar6);
    }
    goto LAB_00114b89;
  }
  if (config->retry_maxtime != 0) {
    newer = tvnow();
    lVar6 = tvdiff(newer,per->retrystart);
    if (SBORROW8(lVar6,config->retry_maxtime * 1000) == lVar6 + config->retry_maxtime * -1000 < 0)
    goto LAB_001148f2;
  }
  if ((CURLE_OPERATION_TIMEDOUT < result) ||
     (uVar10 = 1, pGVar12 = global, (0x10001060U >> (result & CURLE_FTP_COULDNT_USE_REST) & 1) == 0)
     ) {
    if ((result == CURLE_COULDNT_CONNECT) && (config->retry_connrefused != false)) {
      pGVar12 = (GlobalConfig *)local_48;
      curl_easy_getinfo(curl,0x200019,pGVar12);
      uVar10 = (uint)(local_48._0_8_ == 0x6f) * 2;
    }
    else if ((result == CURLE_OK) ||
            ((result == CURLE_HTTP_RETURNED_ERROR && (config->failonerror != false)))) {
      uVar10 = 0;
      pGVar12 = (GlobalConfig *)(local_48 + 8);
      curl_easy_getinfo(curl,0x200030,pGVar12);
      if (((FILE *)(local_48._8_8_ + -0xd8))->_unused2 + 0x13 < (char *)0x2) {
        uVar10 = 0;
        pGVar12 = (GlobalConfig *)local_48;
        curl_easy_getinfo(curl,0x200002,pGVar12);
        if (((local_48._0_8_ - 500 < 5) && (local_48._0_8_ - 500 != 1)) || (local_48._0_8_ == 0x1ad)
           ) {
          uVar10 = 3;
        }
      }
    }
    else {
      uVar10 = 0;
      curl_easy_getinfo(curl,0x200002,local_48);
      pGVar12 = (GlobalConfig *)(local_48 + 8);
      curl_easy_getinfo(curl,0x200030);
      if (((FILE *)local_48._8_8_ == (FILE *)0x8) || ((FILE *)local_48._8_8_ == (FILE *)0x4)) {
        uVar10 = (uint)(local_48._0_8_ - 400 < 100) << 2;
      }
    }
  }
  CVar11 = (CURLcode)pGVar12;
  if (uVar10 != 0) {
    local_48._8_8_ = (FILE *)0x0;
    lVar6 = per->retry_sleep;
    if ((uVar10 == 3) &&
       (curl_easy_getinfo(curl,0x600039,local_48 + 8), (FILE *)local_48._8_8_ != (FILE *)0x0)) {
      lVar6 = 0x7fffffffffffffff;
      if ((long)local_48._8_8_ < 0x20c49ba5e353f8) {
        lVar6 = local_48._8_8_ * 1000;
      }
    }
    warnf(config->global,"Transient problem: %s Will retry in %ld seconds. %ld retries left.\n",
          post_per_transfer::m[uVar10],lVar6 / 1000,per->retry_numretries);
    per->retry_numretries = per->retry_numretries + -1;
    tool_go_sleep(lVar6);
    if (config->retry_delay == 0) {
      lVar6 = 600000;
      if (per->retry_sleep < 0x493e1) {
        lVar6 = per->retry_sleep * 2;
      }
      per->retry_sleep = lVar6;
    }
    if ((((per->outs).bytes == 0) || (outs->filename == (char *)0x0)) ||
       ((per->outs).stream == (FILE *)0x0)) {
LAB_00114b71:
      *(_Bool *)&local_38->filename = true;
      CVar11 = CURLE_OK;
    }
    else {
      if (global->mute == false) {
        curl_mfprintf(global->errors,"Throwing away %ld bytes\n");
      }
      fflush((FILE *)(per->outs).stream);
      iVar3 = fileno((FILE *)(per->outs).stream);
      iVar3 = ftruncate64(iVar3,(per->outs).init);
      if (iVar3 == 0) {
        iVar3 = fseek((FILE *)(per->outs).stream,0,2);
        if (iVar3 == 0) {
          (per->outs).bytes = 0;
          goto LAB_00114b71;
        }
        CVar11 = CURLE_WRITE_ERROR;
        if (global->mute == false) {
          pFVar9 = global->errors;
          pcVar5 = "failed seeking to end of file, exiting\n";
          goto LAB_00114af8;
        }
      }
      else {
        CVar11 = CURLE_WRITE_ERROR;
        if (global->mute == false) {
          pFVar9 = global->errors;
          pcVar5 = "failed to truncate, exiting\n";
LAB_00114af8:
          CVar11 = CURLE_WRITE_ERROR;
          curl_mfprintf(pFVar9,pcVar5);
        }
      }
    }
  }
  if (uVar10 != 0) {
    return CVar11;
  }
LAB_00114b89:
  if ((global->progressmode == 1) && ((per->progressbar).calls != 0)) {
    fputs("\n",(FILE *)(per->progressbar).out);
  }
  if (config->writeout != (char *)0x0) {
    ourWriteOut(per->curl,outs,config->writeout);
  }
  if ((((per->outs).fopened == true) && (pFVar1 = (FILE *)(per->outs).stream, pFVar1 != (FILE *)0x0)
      ) && ((iVar3 = fclose(pFVar1), result == CURLE_OK && (iVar3 != 0)))) {
    result = CURLE_WRITE_ERROR;
    curl_mfprintf(global->errors,"(%d) Failed writing body\n",0x17);
  }
  if ((((result == CURLE_OK) && (config->remote_time == true)) && ((per->outs).s_isreg == true)) &&
     (outs->filename != (char *)0x0)) {
    local_48._0_8_ = -1;
    curl_easy_getinfo(curl,0x60000e,local_48);
    setfiletime(local_48._0_8_,outs->filename,config->global->errors);
  }
  if (((per->heads).fopened == true) &&
     (pFVar1 = (FILE *)(per->heads).stream, pFVar1 != (FILE *)0x0)) {
    fclose(pFVar1);
  }
  if ((per->heads).alloc_filename == true) {
    free((per->heads).filename);
    (per->heads).filename = (char *)0x0;
  }
  if (((per->etag_save).fopened == true) &&
     (pFVar1 = (FILE *)(per->etag_save).stream, pFVar1 != (FILE *)0x0)) {
    fclose(pFVar1);
  }
  if ((per->etag_save).alloc_filename == true) {
    free((per->etag_save).filename);
    (per->etag_save).filename = (char *)0x0;
  }
  curl_easy_cleanup(per->curl);
  if ((per->outs).alloc_filename == true) {
    free(outs->filename);
  }
  free(per->this_url);
  free(per->separator_err);
  free(per->separator);
  free(per->outfile);
  free(per->uploadfile);
  return CURLE_OK;
}

Assistant:

static CURLcode post_per_transfer(struct GlobalConfig *global,
                                  struct per_transfer *per,
                                  CURLcode result,
                                  bool *retryp)
{
  struct OutStruct *outs = &per->outs;
  CURL *curl = per->curl;
  struct OperationConfig *config = per->config;

  if(!curl || !config)
    return result;

  *retryp = FALSE;

  if(per->infdopen)
    close(per->infd);

#ifdef __VMS
  if(is_vms_shell()) {
    /* VMS DCL shell behavior */
    if(!global->showerror)
      vms_show = VMSSTS_HIDE;
  }
  else
#endif
    if(config->synthetic_error) {
      ;
    }
    else if(result && global->showerror) {
      fprintf(global->errors, "curl: (%d) %s\n", result,
              (per->errorbuffer[0]) ? per->errorbuffer :
              curl_easy_strerror(result));
      if(result == CURLE_PEER_FAILED_VERIFICATION)
        fputs(CURL_CA_CERT_ERRORMSG, global->errors);
    }

  /* Set file extended attributes */
  if(!result && config->xattr && outs->fopened && outs->stream) {
    int rc = fwrite_xattr(curl, fileno(outs->stream));
    if(rc)
      warnf(config->global, "Error setting extended attributes: %s\n",
            strerror(errno));
  }

  if(!result && !outs->stream && !outs->bytes) {
    /* we have received no data despite the transfer was successful
       ==> force cration of an empty output file (if an output file
       was specified) */
    long cond_unmet = 0L;
    /* do not create (or even overwrite) the file in case we get no
       data because of unmet condition */
    curl_easy_getinfo(curl, CURLINFO_CONDITION_UNMET, &cond_unmet);
    if(!cond_unmet && !tool_create_output_file(outs, config))
      result = CURLE_WRITE_ERROR;
  }

  if(!outs->s_isreg && outs->stream) {
    /* Dump standard stream buffered data */
    int rc = fflush(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      fprintf(global->errors, "(%d) Failed writing body\n", result);
    }
  }

#ifdef USE_METALINK
  if(per->metalink && !per->metalink_next_res)
    fprintf(global->errors, "Metalink: fetching (%s) from (%s) OK\n",
            per->mlfile->filename, per->this_url);

  if(!per->metalink && config->use_metalink && result == CURLE_OK) {
    int rv = parse_metalink(config, outs, per->this_url);
    if(!rv) {
      fprintf(config->global->errors, "Metalink: parsing (%s) OK\n",
              per->this_url);
    }
    else if(rv == -1)
      fprintf(config->global->errors, "Metalink: parsing (%s) FAILED\n",
              per->this_url);
  }
  else if(per->metalink && result == CURLE_OK && !per->metalink_next_res) {
    int rv;
    (void)fflush(outs->stream);
    rv = metalink_check_hash(global, per->mlfile, outs->filename);
    if(!rv)
      per->metalink_next_res = 1;
  }
#endif /* USE_METALINK */

#ifdef USE_METALINK
  if(outs->metalink_parser)
    metalink_parser_context_delete(outs->metalink_parser);
#endif /* USE_METALINK */

  if(outs->is_cd_filename && outs->stream && !global->mute &&
     outs->filename)
    printf("curl: Saved to filename '%s'\n", outs->filename);

  /* if retry-max-time is non-zero, make sure we haven't exceeded the
     time */
  if(per->retry_numretries &&
     (!config->retry_maxtime ||
      (tvdiff(tvnow(), per->retrystart) <
       config->retry_maxtime*1000L)) ) {
    enum {
      RETRY_NO,
      RETRY_TIMEOUT,
      RETRY_CONNREFUSED,
      RETRY_HTTP,
      RETRY_FTP,
      RETRY_LAST /* not used */
    } retry = RETRY_NO;
    long response;
    if((CURLE_OPERATION_TIMEDOUT == result) ||
       (CURLE_COULDNT_RESOLVE_HOST == result) ||
       (CURLE_COULDNT_RESOLVE_PROXY == result) ||
       (CURLE_FTP_ACCEPT_TIMEOUT == result))
      /* retry timeout always */
      retry = RETRY_TIMEOUT;
    else if(config->retry_connrefused &&
            (CURLE_COULDNT_CONNECT == result)) {
      long oserrno;
      curl_easy_getinfo(curl, CURLINFO_OS_ERRNO, &oserrno);
      if(ECONNREFUSED == oserrno)
        retry = RETRY_CONNREFUSED;
    }
    else if((CURLE_OK == result) ||
            (config->failonerror &&
             (CURLE_HTTP_RETURNED_ERROR == result))) {
      /* If it returned OK. _or_ failonerror was enabled and it
         returned due to such an error, check for HTTP transient
         errors to retry on. */
      long protocol;
      curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);
      if((protocol == CURLPROTO_HTTP) || (protocol == CURLPROTO_HTTPS)) {
        /* This was HTTP(S) */
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);

        switch(response) {
        case 429: /* Too Many Requests (RFC6585) */
        case 500: /* Internal Server Error */
        case 502: /* Bad Gateway */
        case 503: /* Service Unavailable */
        case 504: /* Gateway Timeout */
          retry = RETRY_HTTP;
          /*
           * At this point, we have already written data to the output
           * file (or terminal). If we write to a file, we must rewind
           * or close/re-open the file so that the next attempt starts
           * over from the beginning.
           *
           * TODO: similar action for the upload case. We might need
           * to start over reading from a previous point if we have
           * uploaded something when this was returned.
           */
          break;
        }
      }
    } /* if CURLE_OK */
    else if(result) {
      long protocol;

      curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);
      curl_easy_getinfo(curl, CURLINFO_PROTOCOL, &protocol);

      if((protocol == CURLPROTO_FTP || protocol == CURLPROTO_FTPS) &&
         response / 100 == 4)
        /*
         * This is typically when the FTP server only allows a certain
         * amount of users and we are not one of them.  All 4xx codes
         * are transient.
         */
        retry = RETRY_FTP;
    }

    if(retry) {
      long sleeptime = 0;
      curl_off_t retry_after = 0;
      static const char * const m[]={
        NULL,
        "timeout",
        "connection refused",
        "HTTP error",
        "FTP error"
      };

      sleeptime = per->retry_sleep;
      if(RETRY_HTTP == retry) {
        curl_easy_getinfo(curl, CURLINFO_RETRY_AFTER, &retry_after);
        if(retry_after) {
          /* store in a 'long', make sure it doesn't overflow */
          if(retry_after > LONG_MAX/1000)
            sleeptime = LONG_MAX;
          else
            sleeptime = (long)retry_after * 1000; /* milliseconds */
        }
      }
      warnf(config->global, "Transient problem: %s "
            "Will retry in %ld seconds. "
            "%ld retries left.\n",
            m[retry], sleeptime/1000L, per->retry_numretries);

      per->retry_numretries--;
      tool_go_sleep(sleeptime);
      if(!config->retry_delay) {
        per->retry_sleep *= 2;
        if(per->retry_sleep > RETRY_SLEEP_MAX)
          per->retry_sleep = RETRY_SLEEP_MAX;
      }
      if(outs->bytes && outs->filename && outs->stream) {
        int rc;
        /* We have written data to a output file, we truncate file
         */
        if(!global->mute)
          fprintf(global->errors, "Throwing away %"
                  CURL_FORMAT_CURL_OFF_T " bytes\n",
                  outs->bytes);
        fflush(outs->stream);
        /* truncate file at the position where we started appending */
#ifdef HAVE_FTRUNCATE
        if(ftruncate(fileno(outs->stream), outs->init)) {
          /* when truncate fails, we can't just append as then we'll
             create something strange, bail out */
          if(!global->mute)
            fprintf(global->errors,
                    "failed to truncate, exiting\n");
          return CURLE_WRITE_ERROR;
        }
        /* now seek to the end of the file, the position where we
           just truncated the file in a large file-safe way */
        rc = fseek(outs->stream, 0, SEEK_END);
#else
        /* ftruncate is not available, so just reposition the file
           to the location we would have truncated it. This won't
           work properly with large files on 32-bit systems, but
           most of those will have ftruncate. */
        rc = fseek(outs->stream, (long)outs->init, SEEK_SET);
#endif
        if(rc) {
          if(!global->mute)
            fprintf(global->errors,
                    "failed seeking to end of file, exiting\n");
          return CURLE_WRITE_ERROR;
        }
        outs->bytes = 0; /* clear for next round */
      }
      *retryp = TRUE; /* curl_easy_perform loop */
      return CURLE_OK;
    }
  } /* if retry_numretries */
  else if(per->metalink) {
    /* Metalink: Decide to try the next resource or not. Try the next resource
       if download was not successful. */
    long response;
    if(CURLE_OK == result) {
      /* TODO We want to try next resource when download was
         not successful. How to know that? */
      char *effective_url = NULL;
      curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &effective_url);
      if(effective_url &&
         curl_strnequal(effective_url, "http", 4)) {
        /* This was HTTP(S) */
        curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response);
        if(response != 200 && response != 206) {
          per->metalink_next_res = 1;
          fprintf(global->errors,
                  "Metalink: fetching (%s) from (%s) FAILED "
                  "(HTTP status code %ld)\n",
                  per->mlfile->filename, per->this_url, response);
        }
      }
    }
    else {
      per->metalink_next_res = 1;
      fprintf(global->errors,
              "Metalink: fetching (%s) from (%s) FAILED (%s)\n",
              per->mlfile->filename, per->this_url,
              curl_easy_strerror(result));
    }
  }

  if((global->progressmode == CURL_PROGRESS_BAR) &&
     per->progressbar.calls)
    /* if the custom progress bar has been displayed, we output a
       newline here */
    fputs("\n", per->progressbar.out);

  if(config->writeout)
    ourWriteOut(per->curl, &per->outs, config->writeout);

  /* Close the outs file */
  if(outs->fopened && outs->stream) {
    int rc = fclose(outs->stream);
    if(!result && rc) {
      /* something went wrong in the writing process */
      result = CURLE_WRITE_ERROR;
      fprintf(global->errors, "(%d) Failed writing body\n", result);
    }
  }

  /* File time can only be set _after_ the file has been closed */
  if(!result && config->remote_time && outs->s_isreg && outs->filename) {
    /* Ask libcurl if we got a remote file time */
    curl_off_t filetime = -1;
    curl_easy_getinfo(curl, CURLINFO_FILETIME_T, &filetime);
    setfiletime(filetime, outs->filename, config->global->errors);
  }

  /* Close function-local opened file descriptors */
  if(per->heads.fopened && per->heads.stream)
    fclose(per->heads.stream);

  if(per->heads.alloc_filename)
    Curl_safefree(per->heads.filename);

  if(per->etag_save.fopened && per->etag_save.stream)
    fclose(per->etag_save.stream);

  if(per->etag_save.alloc_filename)
    Curl_safefree(per->etag_save.filename);

  curl_easy_cleanup(per->curl);
  if(outs->alloc_filename)
    free(outs->filename);
  free(per->this_url);
  free(per->separator_err);
  free(per->separator);
  free(per->outfile);
  free(per->uploadfile);

  return CURLE_OK;
}